

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O0

void __thiscall QPainterPath::addPolygon(QPainterPath *this,QPolygonF *polygon)

{
  long lVar1;
  bool bVar2;
  parameter_type t;
  qsizetype qVar3;
  const_reference pQVar4;
  QList<QPointF> *in_RSI;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  int i;
  Element elm;
  int local_34;
  QPointF *p;
  QPainterPath *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p = in_RDI;
  bVar2 = QList<QPointF>::isEmpty((QList<QPointF> *)0x5b7c34);
  if (!bVar2) {
    ensureData((QPainterPath *)in_RDI);
    detach((QPainterPath *)in_RDI);
    QList<QPointF>::constFirst((QList<QPointF> *)in_RDI);
    moveTo(in_stack_ffffffffffffffe0,p);
    local_34 = 1;
    while( true ) {
      t = (parameter_type)(long)local_34;
      qVar3 = QList<QPointF>::size(in_RSI);
      if (qVar3 <= (long)t) break;
      pQVar4 = QList<QPointF>::at((QList<QPointF> *)in_RDI,(qsizetype)t);
      QPointF::x(pQVar4);
      pQVar4 = QList<QPointF>::at((QList<QPointF> *)in_RDI,(qsizetype)t);
      QPointF::y(pQVar4);
      d_func((QPainterPath *)0x5b7d05);
      QList<QPainterPath::Element>::operator<<((QList<QPainterPath::Element> *)in_RDI,t);
      local_34 = local_34 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPainterPath::addPolygon(const QPolygonF &polygon)
{
    if (polygon.isEmpty())
        return;

    ensureData();
    detach();

    moveTo(polygon.constFirst());
    for (int i=1; i<polygon.size(); ++i) {
        Element elm = { polygon.at(i).x(), polygon.at(i).y(), LineToElement };
        d_func()->elements << elm;
    }
}